

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O1

Function * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::Function,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>&,bool&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&>
          (Allocator *this,LocationRange *args,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_1,vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *args_2,
          vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *args_3,
          bool *args_4,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_5,AST **args_6)

{
  size_t *psVar1;
  Function *this_00;
  _List_node_base *p_Var2;
  
  this_00 = (Function *)operator_new(0xd8);
  Function::Function(this_00,args,args_1,args_2,args_3,*args_4,args_5,*args_6);
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = (_List_node_base *)this_00;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(this->allocated).
            super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return this_00;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }